

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::quickCoreQueries_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view queryStr)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  char *__s;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  __y._M_str = "queries";
  __y._M_len = 7;
  bVar1 = std::operator==(queryStr,__y);
  if ((bVar1) ||
     (__y_00._M_str = "available_queries", __y_00._M_len = 0x11,
     bVar1 = std::operator==(queryStr,__y_00), bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&local_70);
    for (p_Var2 = (_Rb_tree_node_base *)querySet_abi_cxx11_._24_8_;
        p_Var2 != (_Rb_tree_node_base *)(querySet_abi_cxx11_ + 8);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::string::string
                ((string *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
      generateJsonQuotedString(&local_70,&local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,',');
    }
    if (__return_storage_ptr__->_M_string_length < 2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,']');
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] = ']'
      ;
    }
    return __return_storage_ptr__;
  }
  __y_01._M_str = "isconnected";
  __y_01._M_len = 0xb;
  bVar1 = std::operator==(queryStr,__y_01);
  if (!bVar1) {
    __y_02._M_str = "name";
    __y_02._M_len = 4;
    bVar1 = std::operator==(queryStr,__y_02);
    if ((bVar1) ||
       (__y_03._M_str = "identifier", __y_03._M_len = 10, bVar1 = std::operator==(queryStr,__y_03),
       bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\"",&local_71);
      std::operator+(&local_70,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(this->super_BrokerBase).identifier);
      std::operator+(__return_storage_ptr__,&local_70,'\"');
    }
    else {
      __y_04._M_str = "exists";
      __y_04._M_len = 6;
      bVar1 = std::operator==(queryStr,__y_04);
      if (bVar1) {
        __s = "true";
        goto LAB_0029b065;
      }
      __y_05._M_str = "version";
      __y_05._M_len = 7;
      bVar1 = std::operator==(queryStr,__y_05);
      if (!bVar1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\"",&local_71);
      std::operator+(&local_70,&local_50,"3.6.1 (2025-02-24)");
      std::operator+(__return_storage_ptr__,&local_70,'\"');
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    return __return_storage_ptr__;
  }
  __s = "false";
  if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7) {
    __s = "true";
  }
LAB_0029b065:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::quickCoreQueries(std::string_view queryStr) const
{
    if ((queryStr == "queries") || (queryStr == "available_queries")) {
        return generateStringVector(querySet, [](const std::string& data) { return data; });
    }
    if (queryStr == "isconnected") {
        return (isConnected()) ? "true" : "false";
    }
    if (queryStr == "name" || queryStr == "identifier") {
        return std::string{"\""} + getIdentifier() + '"';
    }
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return std::string{"\""} + versionString + '"';
    }
    return std::string{};
}